

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::detail::
Dynamic_Caster<chaiscript::dispatch::Proxy_Function_Base,_chaiscript::dispatch::Assignable_Proxy_Function>
::cast(Dynamic_Caster<chaiscript::dispatch::Proxy_Function_Base,_chaiscript::dispatch::Assignable_Proxy_Function>
       *this,Boxed_Value *t_from)

{
  bool bVar1;
  Type_Info *pTVar2;
  bad_boxed_dynamic_cast *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Boxed_Value BVar4;
  Static_String local_b0;
  reference_wrapper<chaiscript::dispatch::Assignable_Proxy_Function> local_a0;
  Assignable_Proxy_Function *local_98;
  Assignable_Proxy_Function *data_1;
  Proxy_Function_Base *d_1;
  Assignable_Proxy_Function *local_80;
  Assignable_Proxy_Function *data;
  Proxy_Function_Base *d;
  shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function> local_68 [2];
  Proxy_Function_Base *local_48;
  shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> local_40;
  Type_Info local_30;
  Proxy_Function_Base *local_18;
  Boxed_Value *t_from_local;
  
  local_18 = (Proxy_Function_Base *)t_from;
  t_from_local = (Boxed_Value *)this;
  pTVar2 = Boxed_Value::get_type_info(t_from);
  user_type<chaiscript::dispatch::Proxy_Function_Base>();
  bVar1 = Type_Info::bare_equal(pTVar2,&local_30);
  if (!bVar1) {
    this_00 = (bad_boxed_dynamic_cast *)__cxa_allocate_exception(0x38);
    pTVar2 = Boxed_Value::get_type_info((Boxed_Value *)local_18);
    utility::Static_String::Static_String<32ul>
              (&local_b0,(char (*) [32])"Unknown dynamic_cast_conversion");
    chaiscript::exception::bad_boxed_dynamic_cast::bad_boxed_dynamic_cast
              (this_00,pTVar2,(type_info *)&dispatch::Assignable_Proxy_Function::typeinfo,&local_b0)
    ;
    __cxa_throw(this_00,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                chaiscript::exception::bad_boxed_dynamic_cast::~bad_boxed_dynamic_cast);
  }
  bVar1 = Boxed_Value::is_pointer((Boxed_Value *)local_18);
  if (bVar1) {
    bVar1 = Boxed_Value::is_const((Boxed_Value *)local_18);
    if (bVar1) {
      local_48 = local_18;
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)&local_40);
      Boxed_Value::
      Boxed_Value<std::shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function_const>,void>
                ((Boxed_Value *)this,&local_40,false);
      std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>::~shared_ptr(&local_40)
      ;
      _Var3._M_pi = extraout_RDX;
    }
    else {
      d = local_18;
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)local_68);
      Boxed_Value::
      Boxed_Value<std::shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function>,void>
                ((Boxed_Value *)this,local_68,false);
      std::shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function>::~shared_ptr(local_68);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  else {
    bVar1 = Boxed_Value::is_const((Boxed_Value *)local_18);
    if (bVar1) {
      data = (Assignable_Proxy_Function *)
             Cast_Helper<const_chaiscript::dispatch::Proxy_Function_Base_&>::cast
                       ((Boxed_Value *)local_18,(Type_Conversions_State *)0x0);
      local_80 = (Assignable_Proxy_Function *)
                 __dynamic_cast(data,&dispatch::Proxy_Function_Base::typeinfo,
                                &dispatch::Assignable_Proxy_Function::typeinfo,0);
      if (local_80 == (Assignable_Proxy_Function *)0x0) {
        __cxa_bad_cast();
      }
      d_1 = (Proxy_Function_Base *)
            std::cref<chaiscript::dispatch::Assignable_Proxy_Function>(local_80);
      Boxed_Value::
      Boxed_Value<std::reference_wrapper<chaiscript::dispatch::Assignable_Proxy_Function_const>,void>
                ((Boxed_Value *)this,
                 (reference_wrapper<const_chaiscript::dispatch::Assignable_Proxy_Function> *)&d_1,
                 false);
      _Var3._M_pi = extraout_RDX_01;
    }
    else {
      data_1 = (Assignable_Proxy_Function *)
               Cast_Helper<chaiscript::dispatch::Proxy_Function_Base_&>::cast
                         ((Boxed_Value *)local_18,(Type_Conversions_State *)0x0);
      local_98 = (Assignable_Proxy_Function *)
                 __dynamic_cast(data_1,&dispatch::Proxy_Function_Base::typeinfo,
                                &dispatch::Assignable_Proxy_Function::typeinfo,0);
      if (local_98 == (Assignable_Proxy_Function *)0x0) {
        __cxa_bad_cast();
      }
      local_a0 = std::ref<chaiscript::dispatch::Assignable_Proxy_Function>(local_98);
      Boxed_Value::
      Boxed_Value<std::reference_wrapper<chaiscript::dispatch::Assignable_Proxy_Function>,void>
                ((Boxed_Value *)this,&local_a0,false);
      _Var3._M_pi = extraout_RDX_02;
    }
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from) {
        if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>())) {
          if (t_from.is_pointer()) {
            // Dynamic cast out the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              return Boxed_Value([&]() {
                if (auto data
                    = std::dynamic_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            } else {
              return Boxed_Value([&]() {
                if (auto data = std::dynamic_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
#ifdef CHAISCRIPT_LIBCPP
                  /// \todo fix this someday after libc++ is fixed.
                  if (std::string(typeid(To).name()).find("Assignable_Proxy_Function") != std::string::npos) {
                    auto from = detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr);
                    if (std::string(typeid(*from).name()).find("Assignable_Proxy_Function_Impl") != std::string::npos) {
                      return std::static_pointer_cast<To>(from);
                    }
                  }
#endif
                  throw std::bad_cast();
                }
              }());
            }
          } else {
            // Pull the reference out of the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
              const To &data = dynamic_cast<const To &>(d);
              return Boxed_Value(std::cref(data));
            } else {
              From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
              To &data = dynamic_cast<To &>(d);
              return Boxed_Value(std::ref(data));
            }
          }
        } else {
          throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
        }
      }